

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *this;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  ImGuiID IVar4;
  ImRect *r_abs;
  
  pIVar2 = GImGui;
  if (GImGui->DragDropActive == true) {
    this = GImGui->CurrentWindow;
    uVar3 = (this->DC).LastItemStatusFlags;
    if ((((uVar3 & 1) != 0) && (GImGui->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0)) &&
       (this->RootWindow == GImGui->HoveredWindowUnderMovingWindow->RootWindow)) {
      uVar3 = uVar3 & 2;
      r_abs = (ImRect *)((this->DC).MenuColumns.Pos + (ulong)uVar3 * 2 + -0x12);
      IVar4 = (this->DC).LastItemId;
      if (IVar4 == 0) {
        IVar4 = ImGuiWindow::GetIDFromRectangle(this,r_abs);
      }
      if ((pIVar2->DragDropPayload).SourceId != IVar4) {
        if (pIVar2->DragDropWithinTarget == false) {
          IVar1 = *(ImVec2 *)((this->DC).MenuColumns.Pos + (ulong)uVar3 * 2 + -0x10);
          (pIVar2->DragDropTargetRect).Min = r_abs->Min;
          (pIVar2->DragDropTargetRect).Max = IVar1;
          pIVar2->DragDropTargetId = IVar4;
          pIVar2->DragDropWithinTarget = true;
          return true;
        }
        __assert_fail("g.DragDropWithinTarget == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                      ,0x266b,"bool ImGui::BeginDragDropTarget()");
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow)
        return false;

    const ImRect& display_rect = (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? window->DC.LastItemDisplayRect : window->DC.LastItemRect;
    ImGuiID id = window->DC.LastItemId;
    if (id == 0)
        id = window->GetIDFromRectangle(display_rect);
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}